

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

Sec_MtrStatus_t * Sec_MiterStatus(Sec_MtrStatus_t *__return_storage_ptr__,Aig_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Sec_MtrStatus_t *Status;
  int i;
  Aig_Obj_t *pChild;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  memset(__return_storage_ptr__,0,0x1c);
  __return_storage_ptr__->iOut = -1;
  iVar2 = Saig_ManPiNum(p);
  __return_storage_ptr__->nInputs = iVar2;
  iVar2 = Aig_ManNodeNum(p);
  __return_storage_ptr__->nNodes = iVar2;
  iVar2 = Saig_ManPoNum(p);
  __return_storage_ptr__->nOutputs = iVar2;
  for (Status._4_4_ = 0; iVar2 = Saig_ManPoNum(p), Status._4_4_ < iVar2;
      Status._4_4_ = Status._4_4_ + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,Status._4_4_);
    pAVar4 = Aig_ObjChild0(pAVar4);
    pAVar5 = Aig_ManConst0(p);
    if (pAVar4 == pAVar5) {
      __return_storage_ptr__->nUnsat = __return_storage_ptr__->nUnsat + 1;
    }
    else {
      pAVar5 = Aig_ManConst1(p);
      if (pAVar4 == pAVar5) {
        __return_storage_ptr__->nSat = __return_storage_ptr__->nSat + 1;
        if (__return_storage_ptr__->iOut == -1) {
          __return_storage_ptr__->iOut = Status._4_4_;
        }
      }
      else {
        pAVar5 = Aig_Regular(pAVar4);
        iVar2 = Saig_ObjIsPi(p,pAVar5);
        if (iVar2 == 0) {
          pAVar5 = Aig_Regular(pAVar4);
          uVar1 = *(ulong *)&pAVar5->field_0x18;
          uVar3 = Aig_IsComplement(pAVar4);
          if (((uint)(uVar1 >> 3) & 1) == uVar3) {
            __return_storage_ptr__->nUndec = __return_storage_ptr__->nUndec + 1;
          }
          else {
            __return_storage_ptr__->nSat = __return_storage_ptr__->nSat + 1;
            if (__return_storage_ptr__->iOut == -1) {
              __return_storage_ptr__->iOut = Status._4_4_;
            }
          }
        }
        else {
          __return_storage_ptr__->nSat = __return_storage_ptr__->nSat + 1;
          if (__return_storage_ptr__->iOut == -1) {
            __return_storage_ptr__->iOut = Status._4_4_;
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ABC_NAMESPACE_IMPL_START

 
////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the status of the miter.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Sec_MtrStatus_t Sec_MiterStatus( Aig_Man_t * p )
{
    Sec_MtrStatus_t Status;
    Aig_Obj_t * pObj, * pChild;
    int i;
    memset( &Status, 0, sizeof(Sec_MtrStatus_t) );
    Status.iOut = -1;
    Status.nInputs  = Saig_ManPiNum( p );
    Status.nNodes   = Aig_ManNodeNum( p );
    Status.nOutputs = Saig_ManPoNum(p);
    Saig_ManForEachPo( p, pObj, i )
    {
        pChild = Aig_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Aig_ManConst0(p) )
            Status.nUnsat++;
        // check if the output is constant 1
        else if ( pChild == Aig_ManConst1(p) )
        {
            Status.nSat++;
            if ( Status.iOut == -1 )
                Status.iOut = i;
        }
        // check if the output is a primary input
        else if ( Saig_ObjIsPi(p, Aig_Regular(pChild)) )
        {
            Status.nSat++;
            if ( Status.iOut == -1 )
                Status.iOut = i;
        }
    // check if the output is 1 for the 0000 pattern
        else if ( Aig_Regular(pChild)->fPhase != (unsigned)Aig_IsComplement(pChild) )
        {
            Status.nSat++;
            if ( Status.iOut == -1 )
                Status.iOut = i;
        }
        else
            Status.nUndec++;
    }
    return Status;
}